

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<10,_2,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Matrix<float,_4,_4> *mat;
  VecAccess<float,_4,_3> local_118;
  Mat4 local_100;
  Matrix<float,_4,_4> local_c0;
  Vector<float,_3> local_80 [2];
  Mat4 local_68;
  Vector<float,_3> local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<2,13>(&local_68,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_28,&local_68);
  getInputValue<2,13>(&local_100,(MatrixCaseUtils *)local_10,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,4,4>(&local_c0,(MatrixCaseUtils *)&local_100,mat);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_80,&local_c0);
  tcu::operator+((tcu *)&local_1c,&local_28,local_80);
  tcu::Vector<float,_4>::xyz(&local_118,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_118,&local_1c);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_c0);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_100);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_68);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}